

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8e_api_v2.c
# Opt level: O0

MPP_RET vp8e_proc_cfg(void *ctx,MpiCmd cmd,void *param)

{
  long lVar1;
  MPP_RET MVar2;
  MppEncCfgSet *src;
  MppEncCfgImpl *impl;
  MppEncCfgSet *cfg;
  Vp8eCtx *p;
  MPP_RET ret;
  void *param_local;
  MpiCmd cmd_local;
  void *ctx_local;
  
  p._4_4_ = MPP_OK;
  lVar1 = *ctx;
  if ((vp8e_debug & 1) != 0) {
    _mpp_log_l(4,"vp8e_api_v2","enter ctx %p cmd %x param %p\n","vp8e_proc_cfg",ctx,(ulong)cmd,param
              );
  }
  if (cmd == MPP_ENC_SET_CFG) {
    if (*(int *)((long)param + 0x10) != 0) {
      p._4_4_ = vp8e_proc_prep_cfg((MppEncPrepCfg *)(lVar1 + 8),
                                   (MppEncPrepCfg *)((long)param + 0x10));
      *(undefined4 *)((long)param + 0x10) = 0;
    }
    if (*(int *)((long)param + 0x350) != 0) {
      MVar2 = vp8e_proc_vp8_cfg((MppEncVp8Cfg *)(lVar1 + 0x348),
                                (MppEncVp8Cfg *)((long)param + 0x350));
      p._4_4_ = MVar2 | p._4_4_;
      *(undefined4 *)((long)param + 0x350) = 0;
    }
    if (*(int *)((long)param + 0xe98) != 0) {
      MVar2 = vp8e_proc_split_cfg((MppEncSliceSplit *)(lVar1 + 0xe90),
                                  (MppEncSliceSplit *)((long)param + 0xe98));
      p._4_4_ = MVar2 | p._4_4_;
      *(undefined4 *)((long)param + 0xe98) = 0;
    }
  }
  else {
    _mpp_log_l(2,"vp8e_api_v2","No correspond cmd found, and can not config!",(char *)0x0);
    p._4_4_ = MPP_NOK;
  }
  if ((vp8e_debug & 1) != 0) {
    _mpp_log_l(4,"vp8e_api_v2","leave ret %d\n","vp8e_proc_cfg",(ulong)(uint)p._4_4_);
  }
  return p._4_4_;
}

Assistant:

static MPP_RET vp8e_proc_cfg(void *ctx, MpiCmd cmd, void *param)
{
    MPP_RET ret = MPP_OK;
    Vp8eCtx *p = (Vp8eCtx *)ctx;
    MppEncCfgSet *cfg = p->cfg;
    MppEncCfgImpl *impl = (MppEncCfgImpl *)param;
    MppEncCfgSet *src = &impl->cfg;

    vp8e_dbg_fun("enter ctx %p cmd %x param %p\n", ctx, cmd, param);
    switch (cmd) {
    case MPP_ENC_SET_CFG : {
        if (src->prep.change) {
            ret |= vp8e_proc_prep_cfg(&cfg->prep, &src->prep);
            src->prep.change = 0;
        }
        if (src->codec.vp8.change) {
            ret |= vp8e_proc_vp8_cfg(&cfg->codec.vp8, &src->codec.vp8);
            src->codec.vp8.change = 0;
        }
        if (src->split.change) {
            ret |= vp8e_proc_split_cfg(&cfg->split, &src->split);
            src->split.change = 0;
        }
    } break;
    default: {
        mpp_err("No correspond cmd found, and can not config!");
        ret = MPP_NOK;
    } break;
    }

    vp8e_dbg_fun("leave ret %d\n", ret);
    return ret;
}